

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O3

int SUNLinSolFree_SPGMR(SUNLinearSolver S)

{
  void *pvVar1;
  int iVar2;
  int *__ptr;
  long lVar3;
  
  if (S != (SUNLinearSolver)0x0) {
    __ptr = (int *)S->content;
    if (__ptr != (int *)0x0) {
      if (*(N_Vector *)(__ptr + 0x1e) != (N_Vector)0x0) {
        N_VDestroy(*(N_Vector *)(__ptr + 0x1e));
        __ptr = (int *)S->content;
        __ptr[0x1e] = 0;
        __ptr[0x1f] = 0;
      }
      if (*(N_Vector *)(__ptr + 0x22) != (N_Vector)0x0) {
        N_VDestroy(*(N_Vector *)(__ptr + 0x22));
        __ptr = (int *)S->content;
        __ptr[0x22] = 0;
        __ptr[0x23] = 0;
      }
      if (*(N_Vector **)(__ptr + 0x18) != (N_Vector *)0x0) {
        N_VDestroyVectorArray(*(N_Vector **)(__ptr + 0x18),*__ptr + 1);
        __ptr = (int *)S->content;
        __ptr[0x18] = 0;
        __ptr[0x19] = 0;
      }
      pvVar1 = *(void **)(__ptr + 0x1a);
      if (pvVar1 != (void *)0x0) {
        iVar2 = *__ptr;
        if (-1 < iVar2) {
          lVar3 = -1;
          do {
            pvVar1 = *(void **)(*(long *)(__ptr + 0x1a) + 8 + lVar3 * 8);
            if (pvVar1 != (void *)0x0) {
              free(pvVar1);
              *(undefined8 *)(*(long *)((long)S->content + 0x68) + 8 + lVar3 * 8) = 0;
              __ptr = (int *)S->content;
              iVar2 = *__ptr;
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 < iVar2);
          pvVar1 = *(void **)(__ptr + 0x1a);
        }
        free(pvVar1);
        __ptr = (int *)S->content;
        __ptr[0x1a] = 0;
        __ptr[0x1b] = 0;
      }
      if (*(void **)(__ptr + 0x1c) != (void *)0x0) {
        free(*(void **)(__ptr + 0x1c));
        __ptr = (int *)S->content;
        __ptr[0x1c] = 0;
        __ptr[0x1d] = 0;
      }
      if (*(void **)(__ptr + 0x20) != (void *)0x0) {
        free(*(void **)(__ptr + 0x20));
        __ptr = (int *)S->content;
        __ptr[0x20] = 0;
        __ptr[0x21] = 0;
      }
      if (*(void **)(__ptr + 0x24) != (void *)0x0) {
        free(*(void **)(__ptr + 0x24));
        __ptr = (int *)S->content;
        __ptr[0x24] = 0;
        __ptr[0x25] = 0;
      }
      if (*(void **)(__ptr + 0x26) != (void *)0x0) {
        free(*(void **)(__ptr + 0x26));
        __ptr = (int *)S->content;
        __ptr[0x26] = 0;
        __ptr[0x27] = 0;
      }
      free(__ptr);
      S->content = (void *)0x0;
    }
    if (S->ops != (SUNLinearSolver_Ops)0x0) {
      free(S->ops);
    }
    free(S);
  }
  return 0;
}

Assistant:

int SUNLinSolFree_SPGMR(SUNLinearSolver S)
{
  int k;

  if (S == NULL) return(SUNLS_SUCCESS);

  if (S->content) {
    /* delete items from within the content structure */
    if (SPGMR_CONTENT(S)->xcor) {
      N_VDestroy(SPGMR_CONTENT(S)->xcor);
      SPGMR_CONTENT(S)->xcor = NULL;
    }
    if (SPGMR_CONTENT(S)->vtemp) {
      N_VDestroy(SPGMR_CONTENT(S)->vtemp);
      SPGMR_CONTENT(S)->vtemp = NULL;
    }
    if (SPGMR_CONTENT(S)->V) {
      N_VDestroyVectorArray(SPGMR_CONTENT(S)->V,
                            SPGMR_CONTENT(S)->maxl+1);
      SPGMR_CONTENT(S)->V = NULL;
    }
    if (SPGMR_CONTENT(S)->Hes) {
      for (k=0; k<=SPGMR_CONTENT(S)->maxl; k++)
        if (SPGMR_CONTENT(S)->Hes[k]) {
          free(SPGMR_CONTENT(S)->Hes[k]);
          SPGMR_CONTENT(S)->Hes[k] = NULL;
        }
      free(SPGMR_CONTENT(S)->Hes);
      SPGMR_CONTENT(S)->Hes = NULL;
    }
    if (SPGMR_CONTENT(S)->givens) {
      free(SPGMR_CONTENT(S)->givens);
      SPGMR_CONTENT(S)->givens = NULL;
    }
    if (SPGMR_CONTENT(S)->yg) {
      free(SPGMR_CONTENT(S)->yg);
      SPGMR_CONTENT(S)->yg = NULL;
    }
    if (SPGMR_CONTENT(S)->cv) {
      free(SPGMR_CONTENT(S)->cv);
      SPGMR_CONTENT(S)->cv = NULL;
    }
    if (SPGMR_CONTENT(S)->Xv) {
      free(SPGMR_CONTENT(S)->Xv);
      SPGMR_CONTENT(S)->Xv = NULL;
    }
    free(S->content); S->content = NULL;
  }
  if (S->ops) { free(S->ops); S->ops = NULL; }
  free(S); S = NULL;
  return(SUNLS_SUCCESS);
}